

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

char ** lys_features_list(lys_module *module,uint8_t **states)

{
  byte bVar1;
  lys_feature *plVar2;
  char **__ptr;
  uint8_t *puVar3;
  ulong uVar4;
  LY_ERR *pLVar5;
  ulong uVar6;
  long lVar7;
  lys_include *plVar8;
  ulong uVar9;
  lys_submodule *plVar10;
  uint uVar11;
  ulong uVar12;
  
  if (module == (lys_module *)0x0) {
LAB_001587ea:
    __ptr = (char **)0x0;
  }
  else {
    bVar1 = module->features_size;
    uVar12 = (ulong)module->inc_size;
    uVar11 = (uint)bVar1;
    if (uVar12 != 0) {
      lVar7 = 0;
      do {
        uVar11 = uVar11 + *(byte *)(*(long *)(module->inc->rev + lVar7 + -8) + 0x47);
        lVar7 = lVar7 + 0x30;
      } while ((ulong)module->inc_size * 0x30 != lVar7);
    }
    __ptr = (char **)malloc((ulong)(uVar11 + 1) * 8);
    if (__ptr == (char **)0x0) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_features_list");
      return (char **)0x0;
    }
    if (states != (uint8_t **)0x0) {
      puVar3 = (uint8_t *)malloc((ulong)(uVar11 + 1));
      *states = puVar3;
      if (puVar3 == (uint8_t *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_features_list");
        free(__ptr);
        goto LAB_001587ea;
      }
    }
    if (bVar1 == 0) {
      uVar4 = 0;
    }
    else {
      lVar7 = 0;
      uVar4 = 0;
      do {
        plVar2 = module->features;
        __ptr[uVar4] = *(char **)(plVar2->padding + lVar7 + -0x1c);
        if (states != (uint8_t **)0x0) {
          (*states)[uVar4] = plVar2->padding[lVar7 + -3] & 1;
        }
        uVar4 = uVar4 + 1;
        lVar7 = lVar7 + 0x40;
      } while (uVar4 < module->features_size);
      uVar12 = (ulong)module->inc_size;
    }
    uVar11 = (uint)uVar4;
    if ((char)uVar12 != '\0') {
      plVar8 = module->inc;
      uVar6 = 0;
      do {
        plVar10 = plVar8[uVar6].submodule;
        if (plVar10->features_size != '\0') {
          lVar7 = 0;
          uVar9 = 0;
          do {
            uVar11 = (int)uVar4 + (int)uVar9;
            plVar2 = plVar10->features;
            __ptr[uVar11] = *(char **)(plVar2->padding + lVar7 + -0x1c);
            if (states != (uint8_t **)0x0) {
              (*states)[uVar11] = plVar2->padding[lVar7 + -3] & 1;
            }
            uVar9 = uVar9 + 1;
            plVar8 = module->inc;
            plVar10 = plVar8[uVar6].submodule;
            lVar7 = lVar7 + 0x40;
          } while (uVar9 < plVar10->features_size);
          uVar12 = (ulong)module->inc_size;
          uVar4 = (ulong)(uint)((int)uVar4 + (int)uVar9);
        }
        uVar11 = (uint)uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar12);
    }
    __ptr[uVar11] = (char *)0x0;
  }
  return __ptr;
}

Assistant:

API const char **
lys_features_list(const struct lys_module *module, uint8_t **states)
{
    const char **result = NULL;
    int i, j;
    unsigned int count;

    if (!module) {
        return NULL;
    }

    count = module->features_size;
    for (i = 0; i < module->inc_size; i++) {
        count += module->inc[i].submodule->features_size;
    }
    result = malloc((count + 1) * sizeof *result);
    if (!result) {
        LOGMEM;
        return NULL;
    }
    if (states) {
        *states = malloc((count + 1) * sizeof **states);
        if (!(*states)) {
            LOGMEM;
            free(result);
            return NULL;
        }
    }
    count = 0;

    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        result[count] = module->features[i].name;
        if (states) {
            if (module->features[i].flags & LYS_FENABLED) {
                (*states)[count] = 1;
            } else {
                (*states)[count] = 0;
            }
        }
        count++;
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            result[count] = module->inc[j].submodule->features[i].name;
            if (states) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    (*states)[count] = 1;
                } else {
                    (*states)[count] = 0;
                }
            }
            count++;
        }
    }

    /* terminating NULL byte */
    result[count] = NULL;

    return result;
}